

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O2

int __thiscall btQuantizedBvh::calcSplittingAxis(btQuantizedBvh *this,int startIndex,int endIndex)

{
  uint uVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  btVector3 bVar13;
  btVector3 bVar14;
  undefined4 local_78;
  undefined4 local_68;
  undefined4 uStack_64;
  
  fVar9 = 0.0;
  fVar11 = 0.0;
  fVar8 = 0.0;
  for (iVar2 = startIndex; iVar2 < endIndex; iVar2 = iVar2 + 1) {
    bVar13 = getAabbMax(this,iVar2);
    bVar14 = getAabbMin(this,iVar2);
    local_78 = bVar13.m_floats[2];
    local_68 = bVar13.m_floats[0];
    uStack_64 = bVar13.m_floats[1];
    fVar9 = fVar9 + (bVar14.m_floats[0] + local_68) * 0.5;
    fVar11 = fVar11 + (bVar14.m_floats[1] + uStack_64) * 0.5;
    fVar8 = fVar8 + (bVar14.m_floats[2] + local_78) * 0.5;
  }
  iVar2 = endIndex - startIndex;
  fVar3 = 1.0 / (float)iVar2;
  fVar10 = 0.0;
  fVar12 = 0.0;
  fVar6 = 0.0;
  while( true ) {
    if (endIndex <= startIndex) break;
    bVar13 = getAabbMax(this,startIndex);
    bVar14 = getAabbMin(this,startIndex);
    local_78 = bVar13.m_floats[2];
    fVar7 = (bVar14.m_floats[2] + local_78) * 0.5 - fVar3 * fVar8;
    local_68 = bVar13.m_floats[0];
    uStack_64 = bVar13.m_floats[1];
    fVar4 = (bVar14.m_floats[0] + local_68) * 0.5 - fVar3 * fVar9;
    fVar5 = (bVar14.m_floats[1] + uStack_64) * 0.5 - fVar3 * fVar11;
    fVar10 = fVar10 + fVar4 * fVar4;
    fVar12 = fVar12 + fVar5 * fVar5;
    fVar6 = fVar6 + fVar7 * fVar7;
    startIndex = startIndex + 1;
  }
  fVar9 = 1.0 / ((float)iVar2 + -1.0);
  fVar10 = fVar9 * fVar10;
  fVar12 = fVar9 * fVar12;
  fVar8 = fVar12;
  if (fVar12 <= fVar10) {
    fVar8 = fVar10;
  }
  uVar1 = 2;
  if (fVar9 * fVar6 <= fVar8) {
    uVar1 = (uint)(fVar10 < fVar12);
  }
  return uVar1;
}

Assistant:

int	btQuantizedBvh::calcSplittingAxis(int startIndex,int endIndex)
{
	int i;

	btVector3 means(btScalar(0.),btScalar(0.),btScalar(0.));
	btVector3 variance(btScalar(0.),btScalar(0.),btScalar(0.));
	int numIndices = endIndex-startIndex;

	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(getAabbMax(i)+getAabbMin(i));
		means+=center;
	}
	means *= (btScalar(1.)/(btScalar)numIndices);
		
	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(getAabbMax(i)+getAabbMin(i));
		btVector3 diff2 = center-means;
		diff2 = diff2 * diff2;
		variance += diff2;
	}
	variance *= (btScalar(1.)/	((btScalar)numIndices-1)	);
	
	return variance.maxAxis();
}